

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

int Llb_NonlinQuantify2(Llb_Mgr_t *p,Llb_Prt_t *pPart1,Llb_Prt_t *pPart2)

{
  int iVar1;
  Llb_Var_t **ppLVar2;
  Llb_Var_t *pLVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  DdNode *n;
  DdNode *n_00;
  Llb_Prt_t *pLVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint *__ptr;
  void *pvVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  ulong local_40;
  
  n = Llb_NonlinCreateCube2(p,pPart1,pPart2);
  Cudd_Ref(n);
  n_00 = Cudd_bddAndAbstract(p->dd,pPart1->bFunc,pPart2->bFunc,n);
  if (n_00 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,n);
    return 0;
  }
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(p->dd,n);
  pLVar8 = (Llb_Prt_t *)calloc(1,0x18);
  iVar6 = p->iPartFree;
  p->pParts[iVar6] = pLVar8;
  p->iPartFree = iVar6 + 1;
  pLVar8->iPart = iVar6;
  iVar6 = Cudd_DagSize(n_00);
  pLVar8->nSize = iVar6;
  pLVar8->bFunc = n_00;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x10;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  pVVar9->pArray = piVar10;
  pLVar8->vVars = pVVar9;
  pVVar9 = pPart1->vVars;
  if (0 < pVVar9->nSize) {
    piVar10 = pVVar9->pArray;
    ppLVar2 = p->pVars;
    lVar14 = 0;
    do {
      pLVar3 = ppLVar2[piVar10[lVar14]];
      pVVar4 = pLVar3->vParts;
      iVar6 = pVVar4->nSize;
      if ((long)iVar6 < 1) {
        if (iVar6 == 0) {
LAB_00943a15:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                        ,0x194,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
        }
        goto LAB_00943a58;
      }
      piVar5 = pVVar4->pArray;
      lVar15 = 1;
      while (piVar5[lVar15 + -1] != pPart1->iPart) {
        bVar17 = lVar15 == iVar6;
        lVar15 = lVar15 + 1;
        if (bVar17) goto LAB_00943a15;
      }
      if ((int)lVar15 < iVar6) {
        do {
          piVar5[lVar15 + -1] = piVar5[lVar15];
          lVar15 = lVar15 + 1;
          iVar6 = pVVar4->nSize;
        } while ((int)lVar15 < iVar6);
      }
      pVVar4->nSize = iVar6 + -1;
      piVar5 = &pLVar3->nScore;
      *piVar5 = *piVar5 - pPart1->nSize;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar9->nSize);
  }
  pVVar9 = pPart2->vVars;
  if (0 < pVVar9->nSize) {
    piVar10 = pVVar9->pArray;
    ppLVar2 = p->pVars;
    lVar14 = 0;
    do {
      pLVar3 = ppLVar2[piVar10[lVar14]];
      pVVar4 = pLVar3->vParts;
      iVar6 = pVVar4->nSize;
      if ((long)iVar6 < 1) {
        if (iVar6 == 0) {
LAB_00943a39:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                        ,0x19b,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
        }
LAB_00943a58:
        __assert_fail("i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
      }
      piVar5 = pVVar4->pArray;
      lVar15 = 1;
      while (piVar5[lVar15 + -1] != pPart2->iPart) {
        bVar17 = lVar15 == iVar6;
        lVar15 = lVar15 + 1;
        if (bVar17) goto LAB_00943a39;
      }
      if ((int)lVar15 < iVar6) {
        do {
          piVar5[lVar15 + -1] = piVar5[lVar15];
          lVar15 = lVar15 + 1;
          iVar6 = pVVar4->nSize;
        } while ((int)lVar15 < iVar6);
      }
      pVVar4->nSize = iVar6 + -1;
      piVar5 = &pLVar3->nScore;
      *piVar5 = *piVar5 - pPart2->nSize;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar9->nSize);
  }
  Extra_SupportArray(p->dd,n_00,p->pSupp);
  iVar6 = p->nVars;
  local_40 = 0;
  iVar13 = 0;
  if (0 < iVar6) {
    lVar14 = 0;
    iVar13 = 0;
    do {
      iVar1 = p->pSupp[lVar14];
      if ((iVar1 != 0) && (p->pVars2Q[lVar14] != 0)) {
        pLVar3 = p->pVars[lVar14];
        piVar10 = &pLVar3->nScore;
        *piVar10 = *piVar10 + pLVar8->nSize;
        Vec_IntPush(pLVar3->vParts,pLVar8->iPart);
        Vec_IntPush(pLVar8->vVars,(int)lVar14);
        iVar6 = p->nVars;
      }
      iVar13 = iVar13 + iVar1;
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar6);
  }
  if (iVar13 < p->nSuppMax) {
    iVar13 = p->nSuppMax;
  }
  p->nSuppMax = iVar13;
  __ptr = (uint *)calloc(1,0x10);
  pVVar9 = pPart1->vVars;
  uVar16 = 0;
  if (0 < pVVar9->nSize) {
    local_40 = 0;
    uVar16 = 0;
    lVar14 = 0;
    do {
      pVVar4 = p->pVars[pVVar9->pArray[lVar14]]->vParts;
      iVar6 = pVVar4->nSize;
      if (iVar6 == 0) {
        Llb_NonlinRemoveVar(p,p->pVars[pVVar9->pArray[lVar14]]);
      }
      else if (iVar6 == 1) {
        pLVar8 = p->pParts[*pVVar4->pArray];
        if (0 < (int)uVar16) {
          uVar12 = 0;
          do {
            if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + uVar12 * 8) == pLVar8) goto LAB_00943865;
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
        }
        uVar7 = (uint)local_40;
        if (uVar16 == uVar7) {
          if ((int)uVar7 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc(0x80);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar11;
            *__ptr = 0x10;
            local_40 = 0x10;
          }
          else {
            local_40 = (ulong)(uVar7 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc(local_40 * 8);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),local_40 * 8);
            }
            *(void **)(__ptr + 2) = pvVar11;
            *__ptr = uVar7 * 2;
          }
        }
        else {
          pvVar11 = *(void **)(__ptr + 2);
        }
        lVar15 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        __ptr[1] = uVar16;
        *(Llb_Prt_t **)((long)pvVar11 + lVar15 * 8) = pLVar8;
      }
LAB_00943865:
      lVar14 = lVar14 + 1;
      pVVar9 = pPart1->vVars;
    } while (lVar14 < pVVar9->nSize);
  }
  pVVar9 = pPart2->vVars;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      pLVar3 = p->pVars[pVVar9->pArray[lVar14]];
      if (pLVar3 != (Llb_Var_t *)0x0) {
        iVar6 = pLVar3->vParts->nSize;
        if (iVar6 == 0) {
          Llb_NonlinRemoveVar(p,pLVar3);
        }
        else if (iVar6 == 1) {
          pLVar8 = p->pParts[*pLVar3->vParts->pArray];
          if (0 < (int)uVar16) {
            uVar12 = 0;
            do {
              if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + uVar12 * 8) == pLVar8) goto LAB_0094397c;
              uVar12 = uVar12 + 1;
            } while (uVar16 != uVar12);
          }
          uVar7 = (uint)local_40;
          if (uVar16 == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar11 = malloc(0x80);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar11;
              *__ptr = 0x10;
              local_40 = 0x10;
            }
            else {
              local_40 = (ulong)(uVar7 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar11 = malloc(local_40 * 8);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr + 2),local_40 * 8);
              }
              *(void **)(__ptr + 2) = pvVar11;
              *__ptr = uVar7 * 2;
            }
          }
          else {
            pvVar11 = *(void **)(__ptr + 2);
          }
          lVar15 = (long)(int)uVar16;
          uVar16 = uVar16 + 1;
          *(Llb_Prt_t **)((long)pvVar11 + lVar15 * 8) = pLVar8;
        }
      }
LAB_0094397c:
      lVar14 = lVar14 + 1;
      pVVar9 = pPart2->vVars;
    } while (lVar14 < pVVar9->nSize);
  }
  Llb_NonlinRemovePart(p,pPart1);
  Llb_NonlinRemovePart(p,pPart2);
  pvVar11 = *(void **)(__ptr + 2);
  if ((int)uVar16 < 1) {
    if (pvVar11 == (void *)0x0) goto LAB_009439f4;
  }
  else {
    uVar12 = 0;
    do {
      Llb_NonlinQuantify1(p,*(Llb_Prt_t **)((long)pvVar11 + uVar12 * 8),0);
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
  }
  free(pvVar11);
LAB_009439f4:
  free(__ptr);
  return 1;
}

Assistant:

int Llb_NonlinQuantify2( Llb_Mgr_t * p, Llb_Prt_t * pPart1, Llb_Prt_t * pPart2 )
{
    int fVerbose = 0;
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bFunc;
    int i, RetValue, nSuppSize;
//    int iPart1 = pPart1->iPart;
//    int iPart2 = pPart2->iPart;

    // create cube to be quantified
    bCube = Llb_NonlinCreateCube2( p, pPart1, pPart2 );   Cudd_Ref( bCube );
if ( fVerbose )
{
printf( "\n" );
printf( "\n" );
Llb_NonlinPrint( p );
printf( "Conjoining partitions %d and %d.\n", pPart1->iPart, pPart2->iPart );
Extra_bddPrintSupport( p->dd, bCube );  printf( "\n" );
}
 
    // derive new function
//    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  Cudd_Ref( bFunc );
/*
    bFunc = Cudd_bddAndAbstractLimit( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, Limit );  
    if ( bFunc == NULL )
    {
        int RetValue;
        Cudd_RecursiveDeref( p->dd, bCube );
        if ( pPart1->nSize < pPart2->nSize )
            RetValue = Llb_NonlinQuantify1( p, pPart1, 1 );
        else
            RetValue = Llb_NonlinQuantify1( p, pPart2, 1 );
        if ( RetValue )
            Limit = Limit + 1000;
        Llb_NonlinQuantify2( p, pPart1, pPart2 );
        return 0;
    }
    Cudd_Ref( bFunc );
*/

//    bFunc = Extra_bddAndAbstractTime( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, TimeOut );  
    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  
    if ( bFunc == NULL )
    {
        Cudd_RecursiveDeref( p->dd, bCube );
        return 0;
    }
    Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( p->dd, bCube );

    // create new partition
    pTemp = p->pParts[p->iPartFree] = ABC_CALLOC( Llb_Prt_t, 1 );
    pTemp->iPart = p->iPartFree++;
    pTemp->nSize = Cudd_DagSize(bFunc);
    pTemp->bFunc = bFunc;
    pTemp->vVars = Vec_IntAlloc( 8 );
    // update variables
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart1->iPart );
        assert( RetValue );
        pVar->nScore -= pPart1->nSize;
    }
    // update variables
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart2->iPart );
        assert( RetValue );
        pVar->nScore -= pPart2->nSize;
    }
    // add variables to the new partition
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( i = 0; i < p->nVars; i++ )
    {
        nSuppSize += p->pSupp[i];
        if ( p->pSupp[i] && p->pVars2Q[i] )
        {
            pVar = Llb_MgrVar( p, i );
            pVar->nScore += pTemp->nSize;
            Vec_IntPush( pVar->vParts, pTemp->iPart );
            Vec_IntPush( pTemp->vVars, i );
        }
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
    // remove variables and collect partitions with singleton variables
    vSingles = Vec_PtrAlloc( 0 );
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        if ( pVar == NULL )
            continue;
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    // remove partitions
    Llb_NonlinRemovePart( p, pPart1 );
    Llb_NonlinRemovePart( p, pPart2 );
    // remove other variables
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
    {
if ( fVerbose )
printf( "Updating partitiong %d with singlton vars.\n", pTemp->iPart );
        Llb_NonlinQuantify1( p, pTemp, 0 );
    }
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrFree( vSingles );
    return 1;
}